

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_SQUAD.cpp
# Opt level: O2

ChQuaternion<double> * __thiscall
chrono::ChFunctionRotation_SQUAD::Get_q
          (ChQuaternion<double> *__return_storage_ptr__,ChFunctionRotation_SQUAD *this,double s)

{
  ChVectorDynamic<> *this_00;
  pointer pCVar1;
  pointer pCVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  long lVar8;
  CoeffReturnType pdVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  ChQuaternion<double> local_148;
  ChQuaternion<double> local_128;
  double local_100;
  double local_f8;
  ChQuaternion<double> q2;
  ChQuaternion<double> q1;
  ChQuaternion<double> slerp1;
  ChQuaternion<double> slerp0;
  ChQuaternion<double> s1;
  ChQuaternion<double> s0;
  
  (*((this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  if (this->closed == true) {
    s = fmod(s,1.0);
  }
  dVar12 = ComputeKnotUfromU(this,s);
  this_00 = &this->knots;
  lVar3 = 0x18;
  uVar10 = 0;
  do {
    uVar11 = uVar10;
    lVar8 = lVar3;
    if ((this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows + -2 <= (long)uVar11) break;
    pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this_00,
                        uVar11 + 1);
    lVar3 = lVar8 + 0x20;
    uVar10 = uVar11 + 1;
  } while (*pdVar9 <= dVar12);
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this_00,uVar11);
  local_f8 = *pdVar9;
  uVar10 = (ulong)((int)uVar11 + 1);
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this_00,uVar10);
  local_100 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this_00,uVar11);
  pCVar1 = (this->rotations).
           super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  q1.m_data[0] = *(double *)((long)pCVar1->m_data + lVar8 + -0x18);
  q1.m_data[1] = *(double *)((long)pCVar1->m_data + lVar8 + -0x10);
  q1.m_data[2] = *(double *)((long)pCVar1->m_data + lVar8 + -8);
  q1.m_data[3] = *(double *)((long)pCVar1->m_data + lVar8);
  q2.m_data[0] = pCVar1[uVar10].m_data[0];
  q2.m_data[1] = pCVar1[uVar10].m_data[1];
  q2.m_data[2] = pCVar1[uVar10].m_data[2];
  q2.m_data[3] = pCVar1[uVar10].m_data[3];
  local_148.m_data[0] = 0.0;
  local_148.m_data[1] = 0.0;
  local_148.m_data[2] = 0.0;
  local_148.m_data[3] = 0.0;
  local_128.m_data[0] = 0.0;
  local_128.m_data[1] = 0.0;
  local_128.m_data[2] = 0.0;
  local_128.m_data[3] = 0.0;
  if (uVar11 == 0) {
    dVar4 = q1.m_data[0];
    dVar5 = q1.m_data[1];
    dVar6 = q1.m_data[2];
    dVar7 = q1.m_data[3];
    if ((this->closed == true) &&
       (pCVar2 = (this->rotations).
                 super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, dVar4 = local_148.m_data[0],
       dVar5 = local_148.m_data[1], dVar6 = local_148.m_data[2], dVar7 = local_148.m_data[3],
       pCVar2 + -2 != &local_148)) {
      dVar4 = pCVar2[-2].m_data[0];
      dVar5 = pCVar2[-2].m_data[1];
      dVar6 = pCVar2[-2].m_data[2];
      dVar7 = pCVar2[-2].m_data[3];
    }
  }
  else {
    uVar10 = uVar11 & 0xffffffff;
    dVar4 = local_148.m_data[0];
    dVar5 = local_148.m_data[1];
    dVar6 = local_148.m_data[2];
    dVar7 = local_148.m_data[3];
    if (pCVar1 + (uVar10 - 1) != &local_148) {
      dVar4 = pCVar1[uVar10 - 1].m_data[0];
      dVar5 = pCVar1[uVar10 - 1].m_data[1];
      dVar6 = pCVar1[uVar10 - 1].m_data[2];
      dVar7 = pCVar1[uVar10 - 1].m_data[3];
    }
  }
  local_148.m_data[3] = dVar7;
  local_148.m_data[2] = dVar6;
  local_148.m_data[1] = dVar5;
  local_148.m_data[0] = dVar4;
  if (uVar11 < ((long)(this->rotations).
                      super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 5) - 2U) {
    uVar11 = uVar11 & 0xffffffff;
    dVar4 = local_128.m_data[0];
    dVar5 = local_128.m_data[1];
    dVar6 = local_128.m_data[2];
    dVar7 = local_128.m_data[3];
    if (pCVar1 + uVar11 + 2 != &local_128) {
      dVar4 = pCVar1[uVar11 + 2].m_data[0];
      dVar5 = pCVar1[uVar11 + 2].m_data[1];
      dVar6 = pCVar1[uVar11 + 2].m_data[2];
      dVar7 = pCVar1[uVar11 + 2].m_data[3];
    }
  }
  else {
    dVar4 = q2.m_data[0];
    dVar5 = q2.m_data[1];
    dVar6 = q2.m_data[2];
    dVar7 = q2.m_data[3];
    if ((this->closed == true) &&
       (dVar4 = local_128.m_data[0], dVar5 = local_128.m_data[1], dVar6 = local_128.m_data[2],
       dVar7 = local_128.m_data[3], pCVar1 + 1 != &local_128)) {
      dVar4 = pCVar1[1].m_data[0];
      dVar5 = pCVar1[1].m_data[1];
      dVar6 = pCVar1[1].m_data[2];
      dVar7 = pCVar1[1].m_data[3];
    }
  }
  local_128.m_data[3] = dVar7;
  local_128.m_data[2] = dVar6;
  local_128.m_data[1] = dVar5;
  local_128.m_data[0] = dVar4;
  dVar12 = (dVar12 - local_f8) / (local_100 - *pdVar9);
  QUADRANGLE(&s0,&local_148,&q1,&q2);
  QUADRANGLE(&s1,&q1,&q2,&local_128);
  SLERP(&slerp0,&q1,&q2,dVar12);
  SLERP(&slerp1,&s0,&s1,dVar12);
  SLERP(__return_storage_ptr__,&slerp0,&slerp1,(dVar12 + dVar12) * (1.0 - dVar12));
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<> ChFunctionRotation_SQUAD::Get_q(double s) const {
	
	double fs = space_fx->Get_y(s);

	double mU;
	if (this->closed)
		mU = fmod(fs, 1.0);
	else
		mU = fs;

    double u = ComputeKnotUfromU(mU);

	// Linear search of span in knot vector. Bisection could be faster, but for small number of knots this is efficient anyway.
	int spanU = 0;
	for (; spanU < this->knots.size()-2; ++spanU)
		if (u < this->knots(spanU+1))
			break;
	
	double span_t = (u - this->knots(spanU)) / (this->knots(spanU + 1) - this->knots(spanU));

	ChQuaternion<> q1 = rotations[spanU];
	ChQuaternion<> q2 = rotations[spanU+1];
	
	ChQuaternion<> q0;
	ChQuaternion<> q3;
	
	if (spanU > 0) {
		q0 = rotations[spanU - 1];
	} 
	else {
		if (this->closed)
			q0 = rotations[rotations.size()-2];
		else
			q0 = q1;
	}

	if (spanU < rotations.size()-2) {
		q3 = rotations[spanU +2];
	} 
	else {
		if (this->closed)
			q3 = rotations[1];
		else
			q3 = q2;
	}

	// TEST: do a simple SLERP
	//return SLERP(q1, q2, span_t);

	ChQuaternion<> s0 = QUADRANGLE(q0, q1, q2);
	ChQuaternion<> s1 = QUADRANGLE(q1, q2, q3);
	
	ChQuaternion<> slerp0 = SLERP(q1, q2, span_t);
    ChQuaternion<> slerp1 = SLERP(s0, s1, span_t);
        
	return SLERP(slerp0, slerp1, 2.0 * span_t * (1.0 - span_t));

}